

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical.cxx
# Opt level: O2

string * __thiscall
Physical::getDescription_abi_cxx11_(string *__return_storage_ptr__,Physical *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::string((string *)&local_80,(string *)&(this->physicalUnit).sUnitName);
  std::__cxx11::string::~string((string *)&local_80);
  if (local_80._M_string_length == 0) {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)&this->physicalDescription);
  }
  else {
    std::operator+(&local_40,&this->physicalDescription," (");
    std::__cxx11::string::string((string *)&local_60,(string *)&(this->physicalUnit).sUnitSymbol);
    std::operator+(&local_80,&local_40,&local_60);
    std::operator+(__return_storage_ptr__,&local_80,")");
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

string Physical::getDescription()
{
	if (physicalUnit.getName().length())
        return physicalDescription + " (" + physicalUnit.getSymbol() + ")";
	else return physicalDescription;
}